

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pSrcBuffer,
          Uint64 SrcOffset,RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
          IBuffer *pDstBuffer,Uint64 DstOffset,Uint64 Size,
          RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Char *pCVar3;
  RenderPassVkImpl *pRVar4;
  BufferVkImpl *pBVar5;
  BufferDesc *Args;
  COMMAND_QUEUE_TYPE Type;
  char (*in_stack_fffffffffffffe28) [2];
  long local_188;
  undefined1 local_180 [8];
  string msg_7;
  undefined1 local_158 [8];
  string msg_6;
  BufferDesc *DstBufferDesc;
  BufferDesc *SrcBufferDesc;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_a8 [8];
  string msg_2;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  Uint64 DstOffset_local;
  IBuffer *pDstBuffer_local;
  Uint64 UStack_20;
  RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode_local;
  Uint64 SrcOffset_local;
  IBuffer *pSrcBuffer_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = DstOffset;
  UStack_20 = SrcOffset;
  SrcOffset_local = (Uint64)pSrcBuffer;
  pSrcBuffer_local = (IBuffer *)this;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"CopyBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6d1);
      std::__cxx11::string::~string((string *)local_58);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d1);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_TRANSFER);
  if (CVar2 != COMMAND_QUEUE_TYPE_TRANSFER) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[11],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a8,(Diligent *)0xc30d41,(char (*) [11])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
               (char (*) [8])DstOffset);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d1);
    std::__cxx11::string::~string((string *)local_a8);
  }
  if (SrcOffset_local == 0) {
    FormatString<char[31]>
              ((string *)((long)&msg_4.field_2 + 8),(char (*) [31])"Source buffer must not be null")
    ;
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d2);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  if (pDstBuffer == (IBuffer *)0x0) {
    FormatString<char[36]>
              ((string *)((long)&msg_5.field_2 + 8),
               (char (*) [36])"Destination buffer must not be null");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d3);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar4 != (RenderPassVkImpl *)0x0) {
    FormatString<char[56]>
              ((string *)&SrcBufferDesc,
               (char (*) [56])"CopyBuffer command must be used outside of render pass.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d4);
    std::__cxx11::string::~string((string *)&SrcBufferDesc);
  }
  pBVar5 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)SrcOffset_local);
  Args = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
         GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  *)pBVar5);
  pBVar5 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pDstBuffer);
  msg_6.field_2._8_8_ =
       DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
       GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                *)pBVar5);
  if (((BufferDesc *)msg_6.field_2._8_8_)->Size < msg.field_2._8_8_ + Size) {
    msg_7.field_2._8_8_ = msg.field_2._8_8_ + Size;
    FormatString<char[24],char_const*,char[7],char_const*,char[23],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
              ((string *)local_158,(Diligent *)"Failed to copy buffer \'",(char (*) [24])Args,
               (char **)"\' to \'",(char (*) [7])msg_6.field_2._8_8_,
               (char **)"\': Destination range [",(char (*) [23])((long)&msg.field_2 + 8),
               (unsigned_long *)0xc684d7,(char (*) [2])((long)&msg_7.field_2 + 8),
               (unsigned_long *)") is out of buffer bounds [0,",
               (char (*) [30])&((BufferDesc *)msg_6.field_2._8_8_)->Size,(unsigned_long *)0xcabce5,
               in_stack_fffffffffffffe28);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d9);
    std::__cxx11::string::~string((string *)local_158);
  }
  if (Args->Size < UStack_20 + Size) {
    local_188 = UStack_20 + Size;
    FormatString<char[24],char_const*,char[7],char_const*,char[18],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
              ((string *)local_180,(Diligent *)"Failed to copy buffer \'",(char (*) [24])Args,
               (char **)"\' to \'",(char (*) [7])msg_6.field_2._8_8_,(char **)"\': Source range [",
               (char (*) [18])&stack0xffffffffffffffe0,(unsigned_long *)0xc684d7,
               (char (*) [2])&local_188,(unsigned_long *)") is out of buffer bounds [0,",
               (char (*) [30])&Args->Size,(unsigned_long *)0xcabce5,in_stack_fffffffffffffe28);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6da);
    std::__cxx11::string::~string((string *)local_180);
  }
  (this->m_Stats).CommandCounters.CopyBuffer = (this->m_Stats).CommandCounters.CopyBuffer + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::CopyBuffer(
    IBuffer*                       pSrcBuffer,
    Uint64                         SrcOffset,
    RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
    IBuffer*                       pDstBuffer,
    Uint64                         DstOffset,
    Uint64                         Size,
    RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "CopyBuffer");
    DEV_CHECK_ERR(pSrcBuffer != nullptr, "Source buffer must not be null");
    DEV_CHECK_ERR(pDstBuffer != nullptr, "Destination buffer must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "CopyBuffer command must be used outside of render pass.");
#ifdef DILIGENT_DEVELOPMENT
    {
        const BufferDesc& SrcBufferDesc = ClassPtrCast<BufferImplType>(pSrcBuffer)->GetDesc();
        const BufferDesc& DstBufferDesc = ClassPtrCast<BufferImplType>(pDstBuffer)->GetDesc();
        DEV_CHECK_ERR(DstOffset + Size <= DstBufferDesc.Size, "Failed to copy buffer '", SrcBufferDesc.Name, "' to '", DstBufferDesc.Name, "': Destination range [", DstOffset, ",", DstOffset + Size, ") is out of buffer bounds [0,", DstBufferDesc.Size, ")");
        DEV_CHECK_ERR(SrcOffset + Size <= SrcBufferDesc.Size, "Failed to copy buffer '", SrcBufferDesc.Name, "' to '", DstBufferDesc.Name, "': Source range [", SrcOffset, ",", SrcOffset + Size, ") is out of buffer bounds [0,", SrcBufferDesc.Size, ")");
    }
#endif

    ++m_Stats.CommandCounters.CopyBuffer;
}